

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

ps_search_t *
allphone_search_init
          (char *name,ngram_model_t *lm,ps_config_t *config,acmod_t *acmod,dict_t *dict,
          dict2pid_t *d2p)

{
  bin_mdef_t *m;
  logmath_t *plVar1;
  int iVar2;
  int32 iVar3;
  int32 iVar4;
  hmm_context_t *phVar5;
  ngram_model_t *pnVar6;
  char *pcVar7;
  int32 *piVar8;
  blkarray_list_t *pbVar9;
  double dVar10;
  int32 silwid;
  allphone_search_t *allphs;
  bin_mdef_t *mdef;
  int i;
  dict2pid_t *d2p_local;
  dict_t *dict_local;
  acmod_t *acmod_local;
  ps_config_t *config_local;
  ngram_model_t *lm_local;
  char *name_local;
  
  name_local = (char *)__ckd_calloc__(1,0x108,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                      ,0x217);
  ps_search_init((ps_search_t *)name_local,&allphone_funcs,"allphone",name,config,acmod,dict,d2p);
  m = acmod->mdef;
  phVar5 = hmm_context_init(m->n_emit_state,acmod->tmat->tp,(int16 *)0x0,m->sseq);
  ((allphone_search_t *)name_local)->hmmctx = phVar5;
  if (((allphone_search_t *)name_local)->hmmctx == (hmm_context_t *)0x0) {
    (*((((allphone_search_t *)name_local)->base).vt)->free)((ps_search_t *)name_local);
    name_local = (char *)0x0;
  }
  else {
    iVar2 = ps_config_bool(config,"allphone_ci");
    ((allphone_search_t *)name_local)->ci_only = iVar2;
    dVar10 = ps_config_float(config,"lw");
    ((allphone_search_t *)name_local)->lw = (int)dVar10;
    phmm_build((allphone_search_t *)name_local);
    if (lm == (ngram_model_t *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
              ,0x244,
              "Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n"
             );
      plVar1 = acmod->lmath;
      dVar10 = ps_config_float(config,"pip");
      iVar2 = logmath_log(plVar1,(float64)dVar10);
      ((allphone_search_t *)name_local)->inspen =
           iVar2 * ((allphone_search_t *)name_local)->lw >> 10;
    }
    else {
      pnVar6 = ngram_model_retain(lm);
      ((allphone_search_t *)name_local)->lm = pnVar6;
      pnVar6 = ((allphone_search_t *)name_local)->lm;
      pcVar7 = bin_mdef_ciphone_str(m,m->sil);
      iVar3 = ngram_wid(pnVar6,pcVar7);
      iVar4 = ngram_unknown_wid(((allphone_search_t *)name_local)->lm);
      if (iVar3 == iVar4) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                ,0x231,"Phonetic LM does not have SIL phone in vocabulary\n");
        allphone_search_free((ps_search_t *)name_local);
        return (ps_search_t *)0x0;
      }
      piVar8 = (int32 *)__ckd_calloc__((long)m->n_ciphone,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                       ,0x238);
      ((allphone_search_t *)name_local)->ci2lmwid = piVar8;
      for (mdef._4_4_ = 0; mdef._4_4_ < m->n_ciphone; mdef._4_4_ = mdef._4_4_ + 1) {
        pnVar6 = ((allphone_search_t *)name_local)->lm;
        pcVar7 = bin_mdef_ciphone_str(m,mdef._4_4_);
        iVar4 = ngram_wid(pnVar6,pcVar7);
        ((allphone_search_t *)name_local)->ci2lmwid[mdef._4_4_] = iVar4;
        iVar2 = ((allphone_search_t *)name_local)->ci2lmwid[mdef._4_4_];
        iVar4 = ngram_unknown_wid(((allphone_search_t *)name_local)->lm);
        if (iVar2 == iVar4) {
          ((allphone_search_t *)name_local)->ci2lmwid[mdef._4_4_] = iVar3;
        }
      }
    }
    ((allphone_search_t *)name_local)->n_tot_frame = 0;
    ((allphone_search_t *)name_local)->frame = -1;
    ((allphone_search_t *)name_local)->segments = (glist_t)0x0;
    plVar1 = acmod->lmath;
    dVar10 = ps_config_float(config,"beam");
    iVar2 = logmath_log(plVar1,(float64)dVar10);
    ((allphone_search_t *)name_local)->beam = iVar2 >> 10;
    plVar1 = acmod->lmath;
    dVar10 = ps_config_float(config,"pbeam");
    iVar2 = logmath_log(plVar1,(float64)dVar10);
    ((allphone_search_t *)name_local)->pbeam = iVar2 >> 10;
    pbVar9 = blkarray_list_init();
    ((allphone_search_t *)name_local)->history = pbVar9;
    dVar10 = ps_config_float(config,"ascale");
    ((allphone_search_t *)name_local)->ascale = (float32)(float)(1.0 / dVar10);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x261,"Allphone(beam: %d, pbeam: %d)\n",
            (ulong)(uint)((allphone_search_t *)name_local)->beam,
            (ulong)(uint)((allphone_search_t *)name_local)->pbeam);
    ptmr_init(&((allphone_search_t *)name_local)->perf);
  }
  return (ps_search_t *)name_local;
}

Assistant:

ps_search_t *
allphone_search_init(const char *name,
                     ngram_model_t * lm,
                     ps_config_t * config,
                     acmod_t * acmod, dict_t * dict, dict2pid_t * d2p)
{
    int i;
    bin_mdef_t *mdef;
    allphone_search_t *allphs;

    allphs = (allphone_search_t *) ckd_calloc(1, sizeof(*allphs));
    ps_search_init(ps_search_base(allphs), &allphone_funcs, PS_SEARCH_TYPE_ALLPHONE, name, config, acmod,
                   dict, d2p);
    mdef = acmod->mdef;

    allphs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(mdef),
                                      acmod->tmat->tp, NULL, mdef->sseq);
    if (allphs->hmmctx == NULL) {
        ps_search_free(ps_search_base(allphs));
        return NULL;
    }

    allphs->ci_only = ps_config_bool(config, "allphone_ci");
    allphs->lw = ps_config_float(config, "lw");

    phmm_build(allphs);

    if (lm) {
	int32 silwid;
	
        allphs->lm = ngram_model_retain(lm);
        
        silwid = ngram_wid(allphs->lm, bin_mdef_ciphone_str(mdef,
                                                            mdef_silphone
                                                            (mdef)));
	if (silwid == ngram_unknown_wid(allphs->lm)) {
	    E_ERROR("Phonetic LM does not have SIL phone in vocabulary\n");
	    allphone_search_free((ps_search_t *) allphs);
	    return NULL;
	}
        
        allphs->ci2lmwid =
            (int32 *) ckd_calloc(mdef->n_ciphone,
                                 sizeof(*allphs->ci2lmwid));
        for (i = 0; i < mdef->n_ciphone; i++) {
            allphs->ci2lmwid[i] =
                ngram_wid(allphs->lm,
                          (char *) bin_mdef_ciphone_str(mdef, i));
            /* Map filler phones and other missing phones to silence if not found */
            if (allphs->ci2lmwid[i] == ngram_unknown_wid(allphs->lm))
                allphs->ci2lmwid[i] = silwid;
        }
    }
    else {
        E_WARN
            ("Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n");
        allphs->inspen =
            (int32) (logmath_log
                     (acmod->lmath, ps_config_float(config, "pip"))
                     * allphs->lw) >> SENSCR_SHIFT;
    }

    allphs->n_tot_frame = 0;
    allphs->frame = -1;
    allphs->segments = NULL;

    /* Get search pruning parameters */
    allphs->beam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "beam"))
        >> SENSCR_SHIFT;
    allphs->pbeam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "pbeam"))
        >> SENSCR_SHIFT;

    /* LM related weights/penalties */
    allphs->history = blkarray_list_init();

    /* Acoustic score scale for posterior probabilities. */
    allphs->ascale = 1.0 / ps_config_float(config, "ascale");

    E_INFO("Allphone(beam: %d, pbeam: %d)\n", allphs->beam, allphs->pbeam);

    ptmr_init(&allphs->perf);

    return (ps_search_t *) allphs;
}